

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O0

void __thiscall tli_window_manager::Text::print(Text *this,Canvas *canvas,int row,int col)

{
  value_type vVar1;
  int iVar2;
  ulong uVar3;
  reference pvVar4;
  reference pvVar5;
  char *pcVar6;
  value_type *pvVar7;
  long lVar8;
  int local_2c;
  int local_28;
  int i;
  int current_col;
  int current_row;
  int col_local;
  int row_local;
  Canvas *canvas_local;
  Text *this_local;
  
  i = 0;
  local_28 = 0;
  for (local_2c = this->index_; uVar3 = std::__cxx11::string::size(), (ulong)(long)local_2c < uVar3;
      local_2c = local_2c + 1) {
    if (local_2c == this->cursor_position_) {
      pvVar4 = std::
               vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
               ::operator[](canvas,(long)(row + i));
      pvVar5 = std::vector<char,_std::allocator<char>_>::operator[](pvVar4,(long)(col + local_28));
      *pvVar5 = '|';
      local_28 = local_28 + 1;
    }
    pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&this->buffer_);
    if (*pcVar6 == '\n') {
      i = i + 1;
      local_28 = 0;
      if (i == (this->super_Box).height_) break;
    }
    else {
      pvVar7 = (value_type *)std::__cxx11::string::operator[]((ulong)&this->buffer_);
      vVar1 = *pvVar7;
      pvVar4 = std::
               vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
               ::operator[](canvas,(long)(row + i));
      pvVar5 = std::vector<char,_std::allocator<char>_>::operator[](pvVar4,(long)(col + local_28));
      *pvVar5 = vVar1;
      local_28 = local_28 + 1;
    }
  }
  iVar2 = this->cursor_position_;
  lVar8 = std::__cxx11::string::size();
  if ((iVar2 == lVar8) && (i < (this->super_Box).height_)) {
    pvVar4 = std::
             vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
             ::operator[](canvas,(long)(row + i));
    pvVar5 = std::vector<char,_std::allocator<char>_>::operator[](pvVar4,(long)(col + local_28));
    *pvVar5 = '|';
  }
  return;
}

Assistant:

void Text::print(Canvas &canvas, int row, int col) const {
    int current_row = 0;
    int current_col = 0;
    for (int i = index_; i < buffer_.size(); ++i) {
        if (i == cursor_position_) {
            canvas[row + current_row][col + current_col] = '|';
            current_col++;
        }

        if (buffer_[i] == '\n') {
            current_row++;
            current_col = 0;
            if (current_row == height_) {
                break;
            }
        } else {
            canvas[row + current_row][col + current_col] = buffer_[i];
            current_col++;
        }
    }
    if (cursor_position_ == buffer_.size() && current_row < height_) {
        canvas[row + current_row][col + current_col] = '|';
    }
}